

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O1

void __thiscall MockParser::MockParser(MockParser *this,char *code)

{
  bool bVar1;
  int pkg;
  uint64_t name;
  Err *pEVar2;
  size_t sVar3;
  ostream *poVar4;
  char *__s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138 [34];
  AssertHelper local_28;
  
  vm_new();
  memcpy(this,local_138,0x110);
  this->cur_fn = 0;
  this->cur_ins = 0;
  name = hash_string("test",4);
  pkg = vm_new_pkg(&this->vm,name);
  pEVar2 = parse(&this->vm,pkg,(char *)0x0,code);
  if (pEVar2 != (Err *)0x0) {
    testing::Message::Message((Message *)local_138);
    __s = pEVar2->desc;
    poVar4 = (ostream *)(local_138[0].ptr_ + 0x10);
    if (__s == (char *)0x0) {
      sVar3 = 6;
      __s = "(null)";
    }
    else {
      sVar3 = strlen(__s);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_138[0].ptr_ + 0x10)," at line ",9);
    std::ostream::operator<<((ostream *)(local_138[0].ptr_ + 0x10),pEVar2->line);
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/test_parser.cpp"
               ,0x23,"Failed");
    testing::internal::AssertHelper::operator=(&local_28,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (((local_138[0].ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
        (bVar1 = testing::internal::IsTrue(true), bVar1)) &&
       (local_138[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_138[0].ptr_ + 8))();
    }
  }
  return;
}

Assistant:

MockParser(const char *code) {
		vm = vm_new();
		cur_fn = 0;
		cur_ins = 0;

		// Add a package (its main function is created automatically)
		int pkg = vm_new_pkg(&vm, hash_string("test", 4));

		// Parse the source code
		Err *err = parse(&vm, pkg, NULL, (char *) code);
		if (err != NULL) {
			ADD_FAILURE() << err->desc << " at line " << err->line;
		}
	}